

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O2

void __thiscall vera::HaveDefines::addDefinesTo(HaveDefines *this,string *_path)

{
  return;
}

Assistant:

void HaveDefines::addDefinesTo( const std::string &_path ) {
#if defined(SUPPORT_EXIV2)
    Exiv2::Image::AutoPtr image = Exiv2::ImageFactory::open(_path);
    assert(image.get() != 0);
    image->readMetadata();

    Exiv2::ExifData exifData = image->exifData();
    // Exiv2::IptcData &iptcData = image->iptcData();

    std::string defines = "";
    for (DefinesMap_cit it = m_defines.begin(); it != m_defines.end(); ++it) {
        defines += it->first + " " + it->second + "\n";
    }
    // Exiv2::ExifKey key("Exif.Photo.UserComment");
    // Exiv2::Value::AutoPtr value = Exiv2::Value::create(Exiv2::asciiString);
    // value->read(defines);

    exifData["Exif.Photo.UserComment"] = defines;
    image->setExifData(exifData);

    image->setComment(defines);

    image->writeMetadata();
#endif
}